

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingSolver
          (MultipleShootingSolver *this,
          shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *ocProblem)

{
  element_type *this_00;
  OptimalControlSolver *in_RDI;
  MultipleShootingTranscription *in_stack_00000140;
  shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *in_stack_ffffffffffffff78;
  shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *in_stack_ffffffffffffff80;
  MultipleShootingTranscription *in_stack_ffffffffffffff88;
  MultipleShootingTranscription *this_01;
  MultipleShootingTranscription *this_02;
  shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> local_20 [2];
  
  std::shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem>::shared_ptr
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  OptimalControlSolver::OptimalControlSolver(in_RDI,local_20);
  std::shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)0x316340);
  in_RDI->_vptr_OptimalControlSolver = (_func_int **)&PTR__MultipleShootingSolver_003fab00;
  this_01 = (MultipleShootingTranscription *)(in_RDI + 1);
  this_02 = this_01;
  std::shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>::
  shared_ptr((shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>
              *)0x316369);
  std::shared_ptr<iDynTree::optimization::Optimizer>::shared_ptr
            ((shared_ptr<iDynTree::optimization::Optimizer> *)0x31637c);
  operator_new(0xa80);
  MultipleShootingTranscription::MultipleShootingTranscription(in_stack_00000140);
  std::
  __shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>
            ((__shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
              *)this_01,in_stack_ffffffffffffff88);
  this_00 = std::
            __shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3163b8);
  std::shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)this_00,
             in_stack_ffffffffffffff78);
  MultipleShootingTranscription::setOptimalControlProblem
            (this_02,(shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)this_01);
  std::shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *)0x3163ec);
  return;
}

Assistant:

MultipleShootingSolver::MultipleShootingSolver(const std::shared_ptr<OptimalControlProblem> &ocProblem)
        : OptimalControlSolver(ocProblem)
        {
            m_transcription.reset(new MultipleShootingTranscription());
            assert(m_transcription);
            m_transcription->setOptimalControlProblem(ocProblem);
        }